

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag_default_read_test.cpp
# Opt level: O0

void __thiscall flag_read::test_method(flag_read *this)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *paVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  long_names;
  initializer_list<char> short_names;
  initializer_list<char> short_names_00;
  bool bVar2;
  element_type eVar3;
  lazy_ostream *plVar4;
  const_iterator this_00;
  const_iterator begin;
  argument_order aVar5;
  undefined8 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_cd0;
  bool local_c9a;
  bool local_c7a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c58;
  bool local_c12;
  bool local_bf2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_bd0;
  basic_cstring<const_char> local_b80;
  basic_cstring<const_char> local_b70;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b60;
  undefined1 local_b3b;
  bool local_b3a;
  value_expr<bool> local_b39;
  assertion_result local_b38;
  basic_cstring<const_char> local_b20;
  basic_cstring<const_char> local_b10 [9];
  undefined4 local_a7c;
  error *er;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_3;
  error *e;
  type local_7e0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7bb;
  undefined1 local_7ba;
  allocator local_7b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  iterator local_790;
  size_type local_788;
  undefined1 local_780 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_2;
  basic_cstring<const_char> local_758;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_748;
  bool local_723;
  bool local_722;
  value_expr<bool> local_721;
  assertion_result local_720;
  basic_cstring<const_char> local_708;
  basic_cstring<const_char> local_6f8;
  basic_cstring<const_char> local_6e8;
  basic_cstring<const_char> local_6d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_6c8;
  bool local_6a3;
  bool local_6a2;
  value_expr<bool> local_6a1;
  assertion_result local_6a0;
  basic_cstring<const_char> local_688;
  basic_cstring<const_char> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_660;
  undefined1 local_658 [8];
  type opts_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  string local_608 [32];
  iterator local_5e8;
  size_type local_5e0;
  undefined1 local_5d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  basic_cstring<const_char> local_5b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_5a0;
  bool local_57b;
  bool local_57a;
  value_expr<bool> local_579;
  assertion_result local_578;
  basic_cstring<const_char> local_560;
  basic_cstring<const_char> local_550;
  basic_cstring<const_char> local_540;
  basic_cstring<const_char> local_530;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_520;
  bool local_4fb;
  bool local_4fa;
  value_expr<bool> local_4f9;
  assertion_result local_4f8;
  basic_cstring<const_char> local_4e0;
  basic_cstring<const_char> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4b8;
  undefined1 local_4b0 [8];
  type opts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  iterator local_460;
  size_type local_458;
  undefined1 local_450 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  allocator local_409;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e8;
  char local_3d1;
  iterator local_3d0;
  size_type local_3c8;
  allocator local_3b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  allocator local_391;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  char local_359;
  iterator local_358;
  size_type local_350;
  allocator local_341;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  allocator local_309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  local_2e8;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>_>,_std::tuple<>,_std::tuple<>_>
  local_2a0;
  undefined1 local_1b0 [8];
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__B_,_int>_>,_std::tuple<>,_std::tuple<>_>
  cmd;
  anon_class_1_0_00000001 f;
  flag_read *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_308,"flag_read",&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_340,"",&local_341);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::basic_command(&local_2e8,&local_308,&local_340);
  local_359 = 'a';
  local_358 = &local_359;
  local_350 = 1;
  std::
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::initializer_list(&local_370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_390,"N",&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3b8,"",&local_3b9);
  short_names_00._M_len = local_350;
  short_names_00._M_array = local_358;
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::
  flag<_A_,_int,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_iorate[P]nonsugar_test_flag_default_read_test_cpp:33:20)_&,_nullptr>
            (&local_2a0,&local_2e8,short_names_00,local_370,&local_390,&local_3b8,
             (anon_class_1_0_00000001 *)&cmd.field_0x197);
  local_3d1 = 'b';
  local_3d0 = &local_3d1;
  local_3c8 = 1;
  std::
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::initializer_list(&local_3e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_408,"N",&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_430,"",
             (allocator *)
             ((long)&args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x32;
  short_names._M_len = local_3c8;
  short_names._M_array = local_3d0;
  long_names._M_len = local_3e8._M_len;
  long_names._M_array = local_3e8._M_array;
  nonsugar::
  basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)65,int>>,std::tuple<>,std::tuple<>>
  ::flag<(char)66,int,flag_read::test_method()::__0_const&>
            ((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__B_,_int>_>,_std::tuple<>,_std::tuple<>_>
              *)local_1b0,&local_2a0,short_names,long_names,&local_408,&local_430,
             (int *)&args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (anon_class_1_0_00000001 *)&cmd.field_0x197);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'A',_int>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_2a0);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_2e8);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  opts.super_option_pair<char,__B_,_int>.value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_480,"-a33",
             (allocator *)
             ((long)&opts.super_option_pair<char,__B_,_int>.value.
                     super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 7));
  opts.super_option_pair<char,__B_,_int>.value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._6_1_ = 0;
  local_460 = &local_480;
  local_458 = 1;
  paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&opts.super_option_pair<char,__B_,_int>.value.
                      super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(paVar1);
  __l_01._M_len = local_458;
  __l_01._M_array = local_460;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_450,__l_01,paVar1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&opts.super_option_pair<char,__B_,_int>.value.
                        super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 5));
  local_bd0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_460;
  do {
    local_bd0 = local_bd0 + -1;
    std::__cxx11::string::~string((string *)local_bd0);
    aVar5 = (argument_order)local_3e8._M_len;
  } while (local_bd0 != &local_480);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&opts.super_option_pair<char,__B_,_int>.value.
                     super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 7));
  local_4b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_450);
  local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_450);
  nonsugar::
  parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)65,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)66,int>>,std::tuple<>,std::tuple<>>>
            ((type *)local_4b0,(nonsugar *)local_4b8,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_4c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__B_,_int>_>,_std::tuple<>,_std::tuple<>_>
              *)0x0,aVar5);
  do {
    uVar6 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4d0,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
               ,99);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar6,&local_4d0,0x31,&local_4e0);
    bVar2 = nonsugar::
            option_map<char,nonsugar::detail::option_pair<char,(char)65,int>,nonsugar::detail::option_pair<char,(char)66,int>>
            ::has<(char)65>((option_map<char,nonsugar::detail::option_pair<char,(char)65,int>,nonsugar::detail::option_pair<char,(char)66,int>>
                             *)local_4b0);
    local_bf2 = false;
    if (bVar2) {
      eVar3 = nonsugar::
              option_map<char,nonsugar::detail::option_pair<char,(char)65,int>,nonsugar::detail::option_pair<char,(char)66,int>>
              ::get<(char)65>((option_map<char,nonsugar::detail::option_pair<char,(char)65,int>,nonsugar::detail::option_pair<char,(char)66,int>>
                               *)local_4b0);
      local_bf2 = eVar3 == 0x21;
    }
    local_4fb = local_bf2;
    boost::test_tools::assertion::seed::operator->*((seed *)&local_4f9,&local_4fa);
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_4f8,&local_4f9,false);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_530,"(opts.has<\'A\'>() && opts.get<\'A\'>() == 33)",0x2a);
    boost::unit_test::operator<<(&local_520,plVar4,&local_530);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_540,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
               ,99);
    boost::test_tools::tt_detail::report_assertion(&local_4f8,&local_520,&local_540,0x31,1,0xe,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_520);
    boost::test_tools::assertion_result::~assertion_result(&local_4f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar6 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_550,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
               ,99);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_560);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar6,&local_550,0x32,&local_560);
    bVar2 = nonsugar::
            option_map<char,nonsugar::detail::option_pair<char,(char)65,int>,nonsugar::detail::option_pair<char,(char)66,int>>
            ::has<(char)66>((option_map<char,nonsugar::detail::option_pair<char,(char)65,int>,nonsugar::detail::option_pair<char,(char)66,int>>
                             *)local_4b0);
    local_c12 = false;
    if (bVar2) {
      eVar3 = nonsugar::
              option_map<char,nonsugar::detail::option_pair<char,(char)65,int>,nonsugar::detail::option_pair<char,(char)66,int>>
              ::get<(char)66>((option_map<char,nonsugar::detail::option_pair<char,(char)65,int>,nonsugar::detail::option_pair<char,(char)66,int>>
                               *)local_4b0);
      local_c12 = eVar3 == 0x32;
    }
    local_57b = local_c12;
    boost::test_tools::assertion::seed::operator->*((seed *)&local_579,&local_57a);
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_578,&local_579,false);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5b0,"(opts.has<\'B\'>() && opts.get<\'B\'>() == 50)",0x2a);
    boost::unit_test::operator<<(&local_5a0,plVar4,&local_5b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &args_1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
               ,99);
    uVar6 = 0xe;
    boost::test_tools::tt_detail::report_assertion
              (&local_578,&local_5a0,
               &args_1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,0x32,1,0xe,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_5a0);
    boost::test_tools::assertion_result::~assertion_result(&local_578);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  nonsugar::
  option_map<char,_nonsugar::detail::option_pair<char,_'A',_int>,_nonsugar::detail::option_pair<char,_'B',_int>_>
  ::~option_map((option_map<char,_nonsugar::detail::option_pair<char,__A_,_int>,_nonsugar::detail::option_pair<char,__B_,_int>_>
                 *)local_4b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_450);
  opts_1.super_option_pair<char,__B_,_int>.value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_628,"-a33",
             (allocator *)
             ((long)&opts_1.super_option_pair<char,__B_,_int>.value.
                     super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_608,"-b66",
             (allocator *)
             ((long)&opts_1.super_option_pair<char,__B_,_int>.value.
                     super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 6));
  opts_1.super_option_pair<char,__B_,_int>.value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._5_1_ = 0;
  local_5e8 = &local_628;
  local_5e0 = 2;
  paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&opts_1.super_option_pair<char,__B_,_int>.value.
                      super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 4);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(paVar1);
  __l_00._M_len = local_5e0;
  __l_00._M_array = local_5e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_5d8,__l_00,paVar1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&opts_1.super_option_pair<char,__B_,_int>.value.
                        super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 4));
  local_c58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5e8;
  do {
    local_c58 = local_c58 + -1;
    std::__cxx11::string::~string((string *)local_c58);
    aVar5 = (argument_order)uVar6;
  } while (local_c58 != &local_628);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&opts_1.super_option_pair<char,__B_,_int>.value.
                     super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&opts_1.super_option_pair<char,__B_,_int>.value.
                     super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 7));
  local_660 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_5d8);
  local_668 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_5d8);
  nonsugar::
  parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)65,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)66,int>>,std::tuple<>,std::tuple<>>>
            ((type *)local_658,(nonsugar *)local_660,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_668,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__B_,_int>_>,_std::tuple<>,_std::tuple<>_>
              *)0x0,aVar5);
  do {
    uVar6 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_678,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
               ,99);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_688);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar6,&local_678,0x37,&local_688);
    bVar2 = nonsugar::
            option_map<char,nonsugar::detail::option_pair<char,(char)65,int>,nonsugar::detail::option_pair<char,(char)66,int>>
            ::has<(char)65>((option_map<char,nonsugar::detail::option_pair<char,(char)65,int>,nonsugar::detail::option_pair<char,(char)66,int>>
                             *)local_658);
    local_c7a = false;
    if (bVar2) {
      eVar3 = nonsugar::
              option_map<char,nonsugar::detail::option_pair<char,(char)65,int>,nonsugar::detail::option_pair<char,(char)66,int>>
              ::get<(char)65>((option_map<char,nonsugar::detail::option_pair<char,(char)65,int>,nonsugar::detail::option_pair<char,(char)66,int>>
                               *)local_658);
      local_c7a = eVar3 == 0x21;
    }
    local_6a3 = local_c7a;
    boost::test_tools::assertion::seed::operator->*((seed *)&local_6a1,&local_6a2);
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_6a0,&local_6a1,false);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6d8,"(opts.has<\'A\'>() && opts.get<\'A\'>() == 33)",0x2a);
    boost::unit_test::operator<<(&local_6c8,plVar4,&local_6d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6e8,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
               ,99);
    boost::test_tools::tt_detail::report_assertion(&local_6a0,&local_6c8,&local_6e8,0x37,1,0xe,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_6c8);
    boost::test_tools::assertion_result::~assertion_result(&local_6a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar6 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6f8,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
               ,99);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_708);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar6,&local_6f8,0x38,&local_708);
    bVar2 = nonsugar::
            option_map<char,nonsugar::detail::option_pair<char,(char)65,int>,nonsugar::detail::option_pair<char,(char)66,int>>
            ::has<(char)66>((option_map<char,nonsugar::detail::option_pair<char,(char)65,int>,nonsugar::detail::option_pair<char,(char)66,int>>
                             *)local_658);
    local_c9a = false;
    if (bVar2) {
      eVar3 = nonsugar::
              option_map<char,nonsugar::detail::option_pair<char,(char)65,int>,nonsugar::detail::option_pair<char,(char)66,int>>
              ::get<(char)66>((option_map<char,nonsugar::detail::option_pair<char,(char)65,int>,nonsugar::detail::option_pair<char,(char)66,int>>
                               *)local_658);
      local_c9a = eVar3 == 0x42;
    }
    local_723 = local_c9a;
    boost::test_tools::assertion::seed::operator->*((seed *)&local_721,&local_722);
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_720,&local_721,false);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_758,"(opts.has<\'B\'>() && opts.get<\'B\'>() == 66)",0x2a);
    boost::unit_test::operator<<(&local_748,plVar4,&local_758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               &args_2.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
               ,99);
    uVar6 = 0xe;
    boost::test_tools::tt_detail::report_assertion
              (&local_720,&local_748,
               &args_2.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,0x38,1,0xe,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_748);
    boost::test_tools::assertion_result::~assertion_result(&local_720);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  nonsugar::
  option_map<char,_nonsugar::detail::option_pair<char,_'A',_int>,_nonsugar::detail::option_pair<char,_'B',_int>_>
  ::~option_map((option_map<char,_nonsugar::detail::option_pair<char,__A_,_int>,_nonsugar::detail::option_pair<char,__B_,_int>_>
                 *)local_658);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_5d8);
  local_7ba = 1;
  local_7b8 = &local_7b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7b0,"-a120",&local_7b9);
  local_7ba = 0;
  local_790 = &local_7b0;
  local_788 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_7bb);
  __l._M_len = local_788;
  __l._M_array = local_790;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_780,__l,&local_7bb);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_7bb);
  local_cd0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_790;
  do {
    local_cd0 = local_cd0 + -1;
    std::__cxx11::string::~string((string *)local_cd0);
    aVar5 = (argument_order)uVar6;
  } while (local_cd0 != &local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
  this_00 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_780);
  begin = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_780);
  nonsugar::
  parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,nonsugar::basic_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)65,int>,nonsugar::detail::flag<std::__cxx11::string,char,(char)66,int>>,std::tuple<>,std::tuple<>>>
            (&local_7e0,(nonsugar *)this_00._M_current,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )begin._M_current,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__B_,_int>_>,_std::tuple<>,_std::tuple<>_>
              *)0x0,aVar5);
  nonsugar::
  option_map<char,_nonsugar::detail::option_pair<char,_'A',_int>,_nonsugar::detail::option_pair<char,_'B',_int>_>
  ::~option_map(&local_7e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_780);
  do {
    uVar6 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_b10,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
               ,99);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b20);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar6,local_b10,0x49,&local_b20);
    local_b3b = 0;
    boost::test_tools::assertion::seed::operator->*((seed *)&local_b39,&local_b3a);
    boost::test_tools::assertion::value_expr<bool>::evaluate(&local_b38,&local_b39,false);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_b70,"false",5);
    boost::unit_test::operator<<(&local_b60,plVar4,&local_b70);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b80,
               "/workspace/llm4binary/github/license_c_cmakelists/iorate[P]nonsugar/test/flag_default_read_test.cpp"
               ,99);
    boost::test_tools::tt_detail::report_assertion(&local_b38,&local_b60,&local_b80,0x49,1,0xe,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_b60);
    boost::test_tools::assertion_result::~assertion_result(&local_b38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_a7c = 0;
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'A',_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'B',_int>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__A_,_int>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__B_,_int>_>,_std::tuple<>,_std::tuple<>_>
                    *)local_1b0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(flag_read)
{
    auto const f = [](std::string const &str) -> std::shared_ptr<int>
        {
            try {
                auto const n = std::stoi(str);
                return n <= 100 ? std::make_shared<int>(n) : nullptr;
            } catch (...) {
                return nullptr;
            }
        };
    auto const cmd = command<char>("flag_read", "")
        .flag<'A', int>({'a'}, {}, "N", "", f)
        .flag<'B', int>({'b'}, {}, "N", "", 50, f)
        ;
    {
        std::vector<std::string> const args = { "-a33" };
        auto const opts = parse(args.begin(), args.end(), cmd);
        BOOST_TEST((opts.has<'A'>() && opts.get<'A'>() == 33));
        BOOST_TEST((opts.has<'B'>() && opts.get<'B'>() == 50));
    }
    {
        std::vector<std::string> const args = { "-a33", "-b66" };
        auto const opts = parse(args.begin(), args.end(), cmd);
        BOOST_TEST((opts.has<'A'>() && opts.get<'A'>() == 33));
        BOOST_TEST((opts.has<'B'>() && opts.get<'B'>() == 66));
    }
    try {
        std::vector<std::string> const args = { "-a120" };
        parse(args.begin(), args.end(), cmd);
    } catch (error const &e) {
        BOOST_TEST(e.message() == "flag_read: invalid argument: -a 120");
        try {
            std::vector<std::string> const args = { "-a33", "-b120" };
            parse(args.begin(), args.end(), cmd);
        } catch (error const &er) {
            BOOST_TEST(er.message() == "flag_read: invalid argument: -b 120");
            return;
        }
        BOOST_TEST(false);
        return;
    }
    BOOST_TEST(false);
}